

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O0

void __thiscall
ON_HistoryRecord::RemapObjectIds(ON_HistoryRecord *this,ON_SimpleArray<ON_UuidPair> *id_remap)

{
  ON_Value *pOVar1;
  unsigned_short uVar2;
  unsigned_short uVar3;
  int iVar4;
  ON_Value **ppOVar5;
  ON_ObjRef *this_00;
  ON_UUID_struct *pOVar6;
  ON_UuidPair *pOVar7;
  ON_PolyEdgeHistory *pOVar8;
  ON_CurveProxyHistory *this_01;
  int local_4c;
  int k;
  ON_PolyEdgeHistoryValue *objrev_v_1;
  int index;
  ON_UuidValue *uuid_v;
  ON_ObjRefValue *objrev_v;
  ON_Value *v;
  int j;
  int i;
  ON_SimpleArray<ON_UuidPair> *id_remap_local;
  ON_HistoryRecord *this_local;
  
  iVar4 = ON_SimpleArray<ON_UuidPair>::Count(id_remap);
  if (0 < iVar4) {
    ON_UuidList::RemapUuids(&this->m_antecedents,id_remap);
    ON_UuidList::RemapUuids(&this->m_descendants,id_remap);
    for (v._4_4_ = 0; iVar4 = ON_SimpleArray<ON_Value_*>::Count(&this->m_value), v._4_4_ < iVar4;
        v._4_4_ = v._4_4_ + 1) {
      ppOVar5 = ON_SimpleArray<ON_Value_*>::operator[](&this->m_value,v._4_4_);
      pOVar1 = *ppOVar5;
      if ((pOVar1 == (ON_Value *)0x0) || (pOVar1->m_value_type != objref_value)) {
        if ((pOVar1 == (ON_Value *)0x0) || (pOVar1->m_value_type != uuid_value)) {
          if ((pOVar1 != (ON_Value *)0x0) && (pOVar1->m_value_type == polyedge_value)) {
            for (v._0_4_ = 0;
                iVar4 = ON_ClassArray<ON_PolyEdgeHistory>::Count
                                  ((ON_ClassArray<ON_PolyEdgeHistory> *)(pOVar1 + 1)),
                (int)v < iVar4; v._0_4_ = (int)v + 1) {
              local_4c = 0;
              while( true ) {
                pOVar8 = ON_ClassArray<ON_PolyEdgeHistory>::operator[]
                                   ((ON_ClassArray<ON_PolyEdgeHistory> *)(pOVar1 + 1),(int)v);
                iVar4 = ON_ClassArray<ON_CurveProxyHistory>::Count(&pOVar8->m_segment);
                if (iVar4 <= local_4c) break;
                pOVar8 = ON_ClassArray<ON_PolyEdgeHistory>::operator[]
                                   ((ON_ClassArray<ON_PolyEdgeHistory> *)(pOVar1 + 1),(int)v);
                this_01 = ON_ClassArray<ON_CurveProxyHistory>::operator[]
                                    (&pOVar8->m_segment,local_4c);
                ON_ObjRef::RemapObjectId(&this_01->m_curve_ref,id_remap);
                local_4c = local_4c + 1;
              }
            }
          }
        }
        else {
          for (v._0_4_ = 0;
              iVar4 = ON_SimpleArray<ON_UUID_struct>::Count
                                ((ON_SimpleArray<ON_UUID_struct> *)(pOVar1 + 1)), (int)v < iVar4;
              v._0_4_ = (int)v + 1) {
            pOVar6 = ON_SimpleArray<ON_UUID_struct>::operator[]
                               ((ON_SimpleArray<ON_UUID_struct> *)(pOVar1 + 1),(int)v);
            iVar4 = ON_SimpleArray<ON_UuidPair>::BinarySearch
                              (id_remap,(ON_UuidPair *)pOVar6,ON_UuidPair::CompareFirstUuid);
            if (-1 < iVar4) {
              pOVar7 = ON_SimpleArray<ON_UuidPair>::operator[](id_remap,iVar4);
              pOVar6 = ON_SimpleArray<ON_UUID_struct>::operator[]
                                 ((ON_SimpleArray<ON_UUID_struct> *)(pOVar1 + 1),(int)v);
              uVar2 = pOVar7->m_uuid[1].Data2;
              uVar3 = pOVar7->m_uuid[1].Data3;
              pOVar6->Data1 = pOVar7->m_uuid[1].Data1;
              pOVar6->Data2 = uVar2;
              pOVar6->Data3 = uVar3;
              *(undefined8 *)pOVar6->Data4 = *(undefined8 *)pOVar7->m_uuid[1].Data4;
            }
          }
        }
      }
      else {
        for (v._0_4_ = 0;
            iVar4 = ON_ClassArray<ON_ObjRef>::Count((ON_ClassArray<ON_ObjRef> *)(pOVar1 + 1)),
            (int)v < iVar4; v._0_4_ = (int)v + 1) {
          this_00 = ON_ClassArray<ON_ObjRef>::operator[]
                              ((ON_ClassArray<ON_ObjRef> *)(pOVar1 + 1),(int)v);
          ON_ObjRef::RemapObjectId(this_00,id_remap);
        }
      }
    }
  }
  return;
}

Assistant:

void ON_HistoryRecord::RemapObjectIds( const ON_SimpleArray<ON_UuidPair>& id_remap )
{
  if ( id_remap.Count() > 0 )
  {
    int i, j;
    m_antecedents.RemapUuids(id_remap);
    m_descendants.RemapUuids(id_remap);
    for ( i = 0; i < m_value.Count(); i++ )
    {
      ON_Value* v = m_value[i];
      if ( v && ON_Value::objref_value == v->m_value_type )
      {
        ON_ObjRefValue* objrev_v = static_cast<ON_ObjRefValue*>(v);
        for ( j = 0; j < objrev_v->m_value.Count(); j++ )
        {
          objrev_v->m_value[j].RemapObjectId(id_remap);
        }
      }
      // 24 May 2021, Mikko, RH-56171:
      // Some commands like Offset use an UUID list to map inputs and outputs.
      // Similar to remapping the objref ids, the uuid lists also need to be
      // updated to use new ids.
      // Other commands that currently use UUID lists are Divide, Slab, Ribbon, 
      // FilletSrf, ChamferSrf, ArrayCrv, Hatch.
      else if (v && ON_Value::uuid_value == v->m_value_type)
      {
        ON_UuidValue* uuid_v = static_cast<ON_UuidValue*>(v);
        for (j = 0; j < uuid_v->m_value.Count(); j++)
        {
          int index = id_remap.BinarySearch((const ON_UuidPair*)&uuid_v->m_value[j], ON_UuidPair::CompareFirstUuid);
          if (index >= 0)
            uuid_v->m_value[j] = id_remap[index].m_uuid[1];
        }
      }
      // 27 Oct 2021, Mikko, RH-66102:
      // Polyedge values contain objrefs and also need remapping.
      // This fixes history replay not working properly on BlendSrf and others
      // when importing/pasting.
      else if (v && ON_Value::polyedge_value == v->m_value_type)
      {
        ON_PolyEdgeHistoryValue* objrev_v = static_cast<ON_PolyEdgeHistoryValue*>(v);
        for (j = 0; j < objrev_v->m_value.Count(); j++)
        {
          int k;
          for (k = 0; k < objrev_v->m_value[j].m_segment.Count(); k++)
          {
            objrev_v->m_value[j].m_segment[k].m_curve_ref.RemapObjectId(id_remap);
          }
        }
      }
    }
  }
}